

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenMPIR.cpp
# Opt level: O0

OpenMPClause * __thiscall OpenMPDirective::addOpenMPClause(OpenMPDirective *this,int k,...)

{
  char *__s;
  OpenMPAffinityClauseModifier modifier1_00;
  OpenMPMapClauseModifier modifier2_00;
  undefined4 type_00;
  undefined4 modifier3_00;
  value_type this_00;
  char in_AL;
  int iVar1;
  size_type sVar2;
  vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_> *pvVar3;
  OpenMPClause *this_01;
  mapped_type *ppvVar4;
  ostream *poVar5;
  reference ppOVar6;
  size_type sVar7;
  char *in_RCX;
  undefined8 in_RDX;
  char *in_R8;
  char *in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  char *in_stack_00000008;
  undefined1 local_248 [16];
  undefined8 local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  undefined8 local_218;
  undefined8 local_208;
  undefined8 local_1f8;
  undefined8 local_1e8;
  undefined8 local_1d8;
  undefined8 local_1c8;
  undefined8 local_1b8;
  undefined8 local_1a8;
  string local_190;
  allocator<char> local_169;
  string local_168 [8];
  string mapper_identifier;
  OpenMPMapClauseType type_2;
  OpenMPMapClauseModifier modifier3;
  OpenMPMapClauseModifier modifier2_1;
  OpenMPMapClauseModifier modifier1_1;
  char *user_defined_identifier_2;
  OpenMPTaskReductionClauseIdentifier identifier_2;
  OpenMPDefaultmapClauseCategory category;
  OpenMPDefaultmapClauseBehavior behavior;
  OpenMPDeviceTypeClauseKind device_type_kind;
  OpenMPFromClauseKind from_kind;
  OpenMPToClauseKind to_kind;
  OpenMPAffinityClauseModifier modifier_6;
  OpenMPDependClauseType type_1;
  OpenMPDependClauseModifier modifier_5;
  OpenMPDepobjUpdateClauseDependeceType type;
  char *user_defined_identifier_1;
  OpenMPInReductionClauseIdentifier identifier_1;
  OpenMPAtomicDefaultMemOrderClauseKind atomic_default_mem_order_kind;
  char *user_defined_allocator_1;
  char *pcStack_e8;
  OpenMPAllocatorClauseAllocator allocator_1;
  char *user_defined_allocator;
  char *pcStack_d8;
  OpenMPAllocateClauseAllocator allocator;
  char *user_defined_priv;
  OpenMPInitializerClausePriv priv;
  OpenMPDeviceClauseModifier modifier_4;
  char *user_defined_kind;
  OpenMPScheduleClauseKind schedule_kind;
  OpenMPScheduleClauseModifier modifier2;
  OpenMPScheduleClauseModifier modifier1;
  OpenMPDistScheduleClauseKind dist_schedule_kind;
  OpenMPLinearClauseModifier modifier_3;
  OpenMPLastprivateClauseModifier modifier_2;
  OpenMPBindClauseBinding bind_binding;
  OpenMPProcBindClauseKind proc_bind_kind;
  char *user_defined_identifier;
  OpenMPReductionClauseIdentifier identifier;
  OpenMPReductionClauseModifier modifier_1;
  OpenMPOrderClauseKind order_kind;
  OpenMPDefaultClauseKind default_kind;
  char *user_defined_modifier;
  OpenMPIfClauseModifier modifier;
  value_type local_70;
  OpenMPClause *new_clause;
  va_list args;
  vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_> *current_clauses;
  vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_> *local_30;
  pair<OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*> local_28;
  OpenMPClauseKind local_18;
  int local_14;
  OpenMPClauseKind kind;
  int k_local;
  OpenMPDirective *this_local;
  
  if (in_AL != '\0') {
    local_218 = in_XMM0_Qa;
    local_208 = in_XMM1_Qa;
    local_1f8 = in_XMM2_Qa;
    local_1e8 = in_XMM3_Qa;
    local_1d8 = in_XMM4_Qa;
    local_1c8 = in_XMM5_Qa;
    local_1b8 = in_XMM6_Qa;
    local_1a8 = in_XMM7_Qa;
  }
  local_238 = in_RDX;
  local_230 = in_RCX;
  local_228 = in_R8;
  local_220 = in_R9;
  local_18 = k;
  local_14 = k;
  _kind = this;
  sVar2 = std::
          map<OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*,_std::less<OpenMPClauseKind>,_std::allocator<std::pair<const_OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*>_>_>
          ::count(&this->clauses,&local_18);
  if (sVar2 == 0) {
    pvVar3 = (vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_> *)operator_new(0x18);
    std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>::vector(pvVar3);
    local_30 = pvVar3;
    std::pair<OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*>::
    pair<OpenMPClauseKind_&,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*,_true>
              (&local_28,&local_18,&local_30);
    std::
    map<OpenMPClauseKind,std::vector<OpenMPClause*,std::allocator<OpenMPClause*>>*,std::less<OpenMPClauseKind>,std::allocator<std::pair<OpenMPClauseKind_const,std::vector<OpenMPClause*,std::allocator<OpenMPClause*>>*>>>
    ::insert<std::pair<OpenMPClauseKind,std::vector<OpenMPClause*,std::allocator<OpenMPClause*>>*>>
              ((map<OpenMPClauseKind,std::vector<OpenMPClause*,std::allocator<OpenMPClause*>>*,std::less<OpenMPClauseKind>,std::allocator<std::pair<OpenMPClauseKind_const,std::vector<OpenMPClause*,std::allocator<OpenMPClause*>>*>>>
                *)&this->clauses,&local_28);
  }
  pvVar3 = getClauses(this,local_18);
  __s = in_stack_00000008;
  args[0].overflow_arg_area = local_248;
  args[0]._0_8_ = &stack0x00000008;
  new_clause._4_4_ = 0x30;
  new_clause._0_4_ = 0x10;
  local_70 = (value_type)0x0;
  modifier1_00 = (OpenMPAffinityClauseModifier)local_238;
  modifier2_00 = (OpenMPMapClauseModifier)local_230;
  switch(local_18) {
  case OMPC_if:
    new_clause._4_4_ = 0x30;
    new_clause._0_4_ = 0x18;
    local_70 = (value_type)0x0;
    _order_kind = (char *)0x0;
    if ((OpenMPAffinityClauseModifier)local_238 == 0xc) {
      new_clause._0_4_ = 0x20;
      _order_kind = local_230;
    }
    local_70 = OpenMPIfClause::addIfClause(this,(OpenMPAffinityClauseModifier)local_238,_order_kind)
    ;
    break;
  case OMPC_num_threads:
  case OMPC_private:
  case OMPC_firstprivate:
  case OMPC_shared:
  case OMPC_copyin:
  case OMPC_align:
  case OMPC_num_teams:
  case OMPC_thread_limit:
  case OMPC_collapse:
  case OMPC_ordered:
  case OMPC_partial:
  case OMPC_nowait:
  case OMPC_full:
  case OMPC_safelen:
  case OMPC_simdlen:
  case OMPC_nontemporal:
  case OMPC_uniform:
  case OMPC_inbranch:
  case OMPC_notinbranch:
  case OMPC_inclusive:
  case OMPC_exclusive:
  case OMPC_copyprivate:
  case OMPC_parallel:
  case OMPC_sections:
  case OMPC_for:
  case OMPC_do:
  case OMPC_taskgroup:
  case OMPC_final:
  case OMPC_untied:
  case OMPC_mergeable:
  case OMPC_priority:
  case OMPC_detach:
  case OMPC_grainsize:
  case OMPC_num_tasks:
  case OMPC_nogroup:
  case OMPC_reverse_offload:
  case OMPC_unified_address:
  case OMPC_unified_shared_memory:
  case OMPC_dynamic_allocators:
  case OMPC_use_device_ptr:
  case OMPC_sizes:
  case OMPC_use_device_addr:
  case OMPC_is_device_ptr:
  case OMPC_has_device_addr:
  case OMPC_link:
  case OMPC_acq_rel:
  case OMPC_release:
  case OMPC_acquire:
  case OMPC_read:
  case OMPC_write:
  case OMPC_update:
  case OMPC_capture:
  case OMPC_seq_cst:
  case OMPC_relaxed:
  case OMPC_hint:
  case OMPC_destroy:
  case OMPC_threads:
  case OMPC_simd:
    sVar7 = std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>::size(pvVar3);
    if (sVar7 == 0) {
      this_01 = (OpenMPClause *)operator_new(0x68);
      OpenMPClause::OpenMPClause(this_01,local_18,0,0);
      local_70 = this_01;
      pvVar3 = (vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_> *)operator_new(0x18);
      memset(pvVar3,0,0x18);
      std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>::vector(pvVar3);
      std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>::push_back(pvVar3,&local_70);
      ppvVar4 = std::
                map<OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*,_std::less<OpenMPClauseKind>,_std::allocator<std::pair<const_OpenMPClauseKind,_std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>_*>_>_>
                ::operator[](&this->clauses,&local_18);
      *ppvVar4 = pvVar3;
    }
    else {
      if (local_18 == OMPC_num_threads) {
        poVar5 = std::operator<<((ostream *)&std::cerr,
                                 "Cannot have two num_threads clause for the directive ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_18);
        std::operator<<(poVar5,", ignored\n");
      }
      else {
        ppOVar6 = std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>::at(pvVar3,0);
        local_70 = *ppOVar6;
      }
      if (local_18 == OMPC_simdlen) {
        poVar5 = std::operator<<((ostream *)&std::cerr,
                                 "Cannot have two simdlen clause for the directive ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_18);
        std::operator<<(poVar5,", ignored\n");
      }
      else {
        ppOVar6 = std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>::at(pvVar3,0);
        local_70 = *ppOVar6;
      }
      if (local_18 == OMPC_safelen) {
        poVar5 = std::operator<<((ostream *)&std::cerr,
                                 "Cannot have two safelen clause for the directive ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_18);
        std::operator<<(poVar5,", ignored\n");
      }
      else {
        ppOVar6 = std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>::at(pvVar3,0);
        local_70 = *ppOVar6;
      }
      if (local_18 == OMPC_seq_cst) {
        poVar5 = std::operator<<((ostream *)&std::cerr,
                                 "Cannot have two seq_cst clause for the directive ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_18);
        std::operator<<(poVar5,", ignored\n");
      }
      else {
        ppOVar6 = std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>::at(pvVar3,0);
        local_70 = *ppOVar6;
      }
      if (local_18 == OMPC_acq_rel) {
        poVar5 = std::operator<<((ostream *)&std::cerr,
                                 "Cannot have two acq_rel clause for the directive ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_18);
        std::operator<<(poVar5,", ignored\n");
      }
      else {
        ppOVar6 = std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>::at(pvVar3,0);
        local_70 = *ppOVar6;
      }
      if (local_18 == OMPC_release) {
        poVar5 = std::operator<<((ostream *)&std::cerr,
                                 "Cannot have two release clause for the directive ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_18);
        std::operator<<(poVar5,", ignored\n");
      }
      else {
        ppOVar6 = std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>::at(pvVar3,0);
        local_70 = *ppOVar6;
      }
      if (local_18 == OMPC_acquire) {
        poVar5 = std::operator<<((ostream *)&std::cerr,
                                 "Cannot have two acquire clause for the directive ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_18);
        std::operator<<(poVar5,", ignored\n");
      }
      else {
        ppOVar6 = std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>::at(pvVar3,0);
        local_70 = *ppOVar6;
      }
      if (local_18 == OMPC_relaxed) {
        poVar5 = std::operator<<((ostream *)&std::cerr,
                                 "Cannot have two relaxed clause for the directive ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_18);
        std::operator<<(poVar5,", ignored\n");
      }
      else {
        ppOVar6 = std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>::at(pvVar3,0);
        local_70 = *ppOVar6;
      }
      if (local_18 == OMPC_hint) {
        poVar5 = std::operator<<((ostream *)&std::cerr,
                                 "Cannot have two hint clause for the directive ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_18);
        std::operator<<(poVar5,", ignored\n");
      }
      else {
        ppOVar6 = std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>::at(pvVar3,0);
        local_70 = *ppOVar6;
      }
    }
    break;
  case OMPC_default:
    new_clause._4_4_ = 0x30;
    new_clause._0_4_ = 0x18;
    local_70 = (value_type)0x0;
    local_70 = OpenMPDefaultClause::addDefaultClause(this,(OpenMPAffinityClauseModifier)local_238);
    break;
  case OMPC_reduction:
    new_clause._4_4_ = 0x30;
    local_70 = (value_type)0x0;
    new_clause._0_4_ = 0x20;
    _bind_binding = (char *)0x0;
    if ((OpenMPMapClauseModifier)local_230 == 0xc) {
      new_clause._0_4_ = 0x28;
      _bind_binding = local_228;
    }
    local_70 = OpenMPReductionClause::addReductionClause
                         (this,(OpenMPAffinityClauseModifier)local_238,
                          (OpenMPMapClauseModifier)local_230,_bind_binding);
    break;
  case OMPC_proc_bind:
    new_clause._4_4_ = 0x30;
    new_clause._0_4_ = 0x18;
    local_70 = (value_type)0x0;
    local_70 = OpenMPProcBindClause::addProcBindClause(this,(OpenMPAffinityClauseModifier)local_238)
    ;
    break;
  case OMPC_allocate:
    new_clause._4_4_ = 0x30;
    new_clause._0_4_ = 0x18;
    local_70 = (value_type)0x0;
    pcStack_e8 = (char *)0x0;
    if ((OpenMPAffinityClauseModifier)local_238 == 8) {
      new_clause._0_4_ = 0x20;
      pcStack_e8 = local_230;
    }
    local_70 = OpenMPAllocateClause::addAllocateClause
                         (this,(OpenMPAffinityClauseModifier)local_238,pcStack_e8);
    break;
  case OMPC_lastprivate:
    new_clause._4_4_ = 0x30;
    new_clause._0_4_ = 0x18;
    local_70 = (value_type)0x0;
    local_70 = OpenMPLastprivateClause::addLastprivateClause
                         (this,(OpenMPAffinityClauseModifier)local_238);
    break;
  case OMPC_order:
    new_clause._4_4_ = 0x30;
    new_clause._0_4_ = 0x18;
    local_70 = (value_type)0x0;
    local_70 = OpenMPOrderClause::addOrderClause(this,(OpenMPAffinityClauseModifier)local_238);
    break;
  case OMPC_linear:
    new_clause._4_4_ = 0x30;
    new_clause._0_4_ = 0x18;
    local_70 = (value_type)0x0;
    local_70 = OpenMPLinearClause::addLinearClause(this,(OpenMPAffinityClauseModifier)local_238);
    break;
  case OMPC_schedule:
    new_clause._4_4_ = 0x30;
    local_70 = (value_type)0x0;
    new_clause._0_4_ = 0x28;
    _priv = (char *)0x0;
    if ((OpenMPScheduleClauseKind)local_228 == OMPC_SCHEDULE_KIND_user) {
      new_clause._0_4_ = 0x30;
      _priv = local_220;
    }
    local_70 = OpenMPScheduleClause::addScheduleClause
                         (this,(OpenMPAffinityClauseModifier)local_238,
                          (OpenMPMapClauseModifier)local_230,(OpenMPScheduleClauseKind)local_228,
                          _priv);
    break;
  case OMPC_aligned:
    local_70 = OpenMPAlignedClause::addAlignedClause(this);
    break;
  case OMPC_dist_schedule:
    new_clause._4_4_ = 0x30;
    new_clause._0_4_ = 0x18;
    local_70 = (value_type)0x0;
    local_70 = OpenMPDistScheduleClause::addDistScheduleClause
                         (this,(OpenMPAffinityClauseModifier)local_238);
    break;
  case OMPC_bind:
    new_clause._4_4_ = 0x30;
    new_clause._0_4_ = 0x18;
    local_70 = (value_type)0x0;
    local_70 = OpenMPBindClause::addBindClause(this,(OpenMPAffinityClauseModifier)local_238);
    break;
  case OMPC_allocator:
    new_clause._4_4_ = 0x30;
    new_clause._0_4_ = 0x18;
    local_70 = (value_type)0x0;
    _identifier_1 = (char *)0x0;
    if ((OpenMPAffinityClauseModifier)local_238 == 8) {
      new_clause._0_4_ = 0x20;
      _identifier_1 = local_230;
    }
    local_70 = OpenMPAllocatorClause::addAllocatorClause
                         (this,(OpenMPAffinityClauseModifier)local_238,_identifier_1);
    break;
  case OMPC_initializer:
    new_clause._4_4_ = 0x30;
    new_clause._0_4_ = 0x18;
    local_70 = (value_type)0x0;
    pcStack_d8 = (char *)0x0;
    if ((OpenMPAffinityClauseModifier)local_238 == OMPC_AFFINITY_MODIFIER_unspecified) {
      new_clause._0_4_ = 0x20;
      pcStack_d8 = local_230;
    }
    local_70 = OpenMPInitializerClause::addInitializerClause
                         (this,(OpenMPAffinityClauseModifier)local_238,pcStack_d8);
    break;
  default:
    break;
  case OMPC_in_reduction:
    new_clause._4_4_ = 0x30;
    new_clause._0_4_ = 0x18;
    local_70 = (value_type)0x0;
    _modifier_5 = (char *)0x0;
    if ((OpenMPAffinityClauseModifier)local_238 == 0xc) {
      new_clause._0_4_ = 0x20;
      _modifier_5 = local_230;
    }
    local_70 = OpenMPInReductionClause::addInReductionClause
                         (this,(OpenMPAffinityClauseModifier)local_238,_modifier_5);
    break;
  case OMPC_depend:
    new_clause._4_4_ = 0x30;
    local_70 = (value_type)0x0;
    new_clause._0_4_ = 0x20;
    local_70 = OpenMPDependClause::addDependClause
                         (this,(OpenMPAffinityClauseModifier)local_238,
                          (OpenMPMapClauseModifier)local_230);
    break;
  case OMPC_affinity:
    new_clause._4_4_ = 0x30;
    new_clause._0_4_ = 0x18;
    local_70 = (value_type)0x0;
    local_70 = OpenMPAffinityClause::addAffinityClause(this,(OpenMPAffinityClauseModifier)local_238)
    ;
    break;
  case OMPC_atomic_default_mem_order:
    new_clause._4_4_ = 0x30;
    new_clause._0_4_ = 0x18;
    local_70 = (value_type)0x0;
    local_70 = OpenMPAtomicDefaultMemOrderClause::addAtomicDefaultMemOrderClause
                         (this,(OpenMPAffinityClauseModifier)local_238);
    break;
  case OMPC_ext_implementation_defined_requirement:
    local_70 = OpenMPExtImplementationDefinedRequirementClause::
               addExtImplementationDefinedRequirementClause(this);
    break;
  case OMPC_device:
    new_clause._4_4_ = 0x30;
    new_clause._0_4_ = 0x18;
    local_70 = (value_type)0x0;
    local_70 = OpenMPDeviceClause::addDeviceClause(this,(OpenMPAffinityClauseModifier)local_238);
    break;
  case OMPC_map:
    new_clause._4_4_ = 0x30;
    local_70 = (value_type)0x0;
    mapper_identifier.field_2._12_4_ = (OpenMPScheduleClauseKind)local_228;
    mapper_identifier.field_2._8_4_ = local_220._0_4_;
    args[0]._0_8_ = &stack0x00000010;
    new_clause._0_4_ = 0x30;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_168,__s,&local_169);
    std::allocator<char>::~allocator(&local_169);
    modifier3_00 = mapper_identifier.field_2._12_4_;
    type_00 = mapper_identifier.field_2._8_4_;
    std::__cxx11::string::string((string *)&local_190,local_168);
    local_70 = OpenMPMapClause::addMapClause
                         (this,modifier1_00,modifier2_00,modifier3_00,type_00,&local_190);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::~string(local_168);
    break;
  case OMPC_defaultmap:
    new_clause._4_4_ = 0x30;
    local_70 = (value_type)0x0;
    new_clause._0_4_ = 0x20;
    local_70 = OpenMPDefaultmapClause::addDefaultmapClause
                         (this,(OpenMPAffinityClauseModifier)local_238,
                          (OpenMPMapClauseModifier)local_230);
    break;
  case OMPC_to:
    new_clause._4_4_ = 0x30;
    new_clause._0_4_ = 0x18;
    local_70 = (value_type)0x0;
    local_70 = OpenMPToClause::addToClause(this,(OpenMPAffinityClauseModifier)local_238);
    break;
  case OMPC_from:
    new_clause._4_4_ = 0x30;
    new_clause._0_4_ = 0x18;
    local_70 = (value_type)0x0;
    local_70 = OpenMPFromClause::addFromClause(this,(OpenMPAffinityClauseModifier)local_238);
    break;
  case OMPC_uses_allocators:
    local_70 = OpenMPUsesAllocatorsClause::addUsesAllocatorsClause(this);
    break;
  case OMPC_when:
    local_70 = OpenMPWhenClause::addWhenClause(this);
    break;
  case OMPC_match:
    local_70 = OpenMPMatchClause::addMatchClause(this);
    break;
  case OMPC_device_type:
    new_clause._4_4_ = 0x30;
    new_clause._0_4_ = 0x18;
    local_70 = (value_type)0x0;
    local_70 = OpenMPDeviceTypeClause::addDeviceTypeClause
                         (this,(OpenMPAffinityClauseModifier)local_238);
    break;
  case OMPC_task_reduction:
    new_clause._4_4_ = 0x30;
    new_clause._0_4_ = 0x18;
    local_70 = (value_type)0x0;
    _modifier2_1 = (char *)0x0;
    if ((OpenMPAffinityClauseModifier)local_238 == 0xc) {
      new_clause._0_4_ = 0x20;
      _modifier2_1 = local_230;
    }
    local_70 = OpenMPTaskReductionClause::addTaskReductionClause
                         (this,(OpenMPAffinityClauseModifier)local_238,_modifier2_1);
    break;
  case OMPC_depobj_update:
    new_clause._4_4_ = 0x30;
    new_clause._0_4_ = 0x18;
    local_70 = (value_type)0x0;
    local_70 = OpenMPDepobjUpdateClause::addDepobjUpdateClause
                         (this,(OpenMPAffinityClauseModifier)local_238);
  }
  if ((local_70 != (OpenMPClause *)0x0) &&
     (iVar1 = OpenMPClause::getClausePosition(local_70), iVar1 == -1)) {
    pvVar3 = getClausesInOriginalOrder(this);
    std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>::push_back(pvVar3,&local_70);
    this_00 = local_70;
    pvVar3 = getClausesInOriginalOrder(this);
    sVar7 = std::vector<OpenMPClause_*,_std::allocator<OpenMPClause_*>_>::size(pvVar3);
    OpenMPClause::setClausePosition(this_00,(int)sVar7 + -1);
  }
  return local_70;
}

Assistant:

OpenMPClause * OpenMPDirective::addOpenMPClause(int k, ... ) {

    OpenMPClauseKind kind = (OpenMPClauseKind)k;
    // Check whether the given kind of clause exists first.
    // If not, create an empty vector.
    if (clauses.count(kind) == 0) {
        clauses.insert(std::pair<OpenMPClauseKind, std::vector<OpenMPClause*>*>(kind, new std::vector<OpenMPClause*>));
    };
    std::vector<OpenMPClause*>* current_clauses = getClauses(kind);
    va_list args;
    va_start(args, k);
    OpenMPClause * new_clause = NULL;

    switch (kind) {
        case OMPC_num_threads:
        case OMPC_private:
        case OMPC_firstprivate:
        case OMPC_shared:
        case OMPC_num_teams:
        case OMPC_thread_limit:
        case OMPC_copyin:
        case OMPC_align:
        case OMPC_collapse:
        case OMPC_ordered:
        case OMPC_partial:
        case OMPC_nowait:
        case OMPC_full:
        case OMPC_safelen:
        case OMPC_simdlen:
        case OMPC_nontemporal:
        case OMPC_uniform:
        case OMPC_inbranch:
        case OMPC_notinbranch :
        case OMPC_copyprivate : 
        case OMPC_parallel:    
        case OMPC_sections: 
        case OMPC_for:
        case OMPC_do:
        case OMPC_taskgroup:
        case OMPC_inclusive:
        case OMPC_exclusive:
        case OMPC_use_device_ptr :
        case OMPC_use_device_addr :
        case OMPC_grainsize :
        case OMPC_num_tasks :
        case OMPC_nogroup :
        case OMPC_final :
        case OMPC_untied :
        case OMPC_mergeable :
        case OMPC_priority :
        case OMPC_detach :
        case OMPC_reverse_offload :
        case OMPC_unified_address :
        case OMPC_unified_shared_memory :
        case OMPC_dynamic_allocators :
        case OMPC_is_device_ptr :
        case OMPC_has_device_addr :
        case OMPC_link :
        case OMPC_threads:
        case OMPC_simd:
        case OMPC_acq_rel : 
        case OMPC_seq_cst : 
        case OMPC_release : 
        case OMPC_acquire : 
        case OMPC_relaxed : 
        case OMPC_read : 
        case OMPC_write : 
        case OMPC_update : 
        case OMPC_capture : 
        case OMPC_hint :
        case OMPC_destroy:
        case OMPC_sizes:
        
        {
            if (current_clauses->size() == 0) {
                new_clause = new OpenMPClause(kind);
                current_clauses = new std::vector<OpenMPClause*>();
                current_clauses->push_back(new_clause);
                clauses[kind] = current_clauses;
            } else {
                if (kind == OMPC_num_threads) {
                    std::cerr << "Cannot have two num_threads clause for the directive " << kind << ", ignored\n";
                } else {
                    /* we can have multiple clause and we merge them together now, thus we return the object that is already created */
                    new_clause = current_clauses->at(0);
                }
               if (kind == OMPC_simdlen) {
                    std::cerr << "Cannot have two simdlen clause for the directive " << kind << ", ignored\n";
                } else {
                    /* we can have multiple clause and we merge them together now, thus we return the object that is already created */
                    new_clause = current_clauses->at(0);
                }
               if (kind == OMPC_safelen) {
                    std::cerr << "Cannot have two safelen clause for the directive " << kind << ", ignored\n";
                } else {
                    /* we can have multiple clause and we merge them together now, thus we return the object that is already created */
                    new_clause = current_clauses->at(0);
                }
               if (kind == OMPC_seq_cst) {
                    std::cerr << "Cannot have two seq_cst clause for the directive " << kind << ", ignored\n";
                } else {
                    /* we can have multiple clause and we merge them together now, thus we return the object that is already created */
                    new_clause = current_clauses->at(0);
                }
               if (kind == OMPC_acq_rel) {
                    std::cerr << "Cannot have two acq_rel clause for the directive " << kind << ", ignored\n";
                } else {
                    /* we can have multiple clause and we merge them together now, thus we return the object that is already created */
                    new_clause = current_clauses->at(0);
                }
               if (kind == OMPC_release) {
                    std::cerr << "Cannot have two release clause for the directive " << kind << ", ignored\n";
                } else {
                    /* we can have multiple clause and we merge them together now, thus we return the object that is already created */
                    new_clause = current_clauses->at(0);
                }
               if (kind == OMPC_acquire) {
                    std::cerr << "Cannot have two acquire clause for the directive " << kind << ", ignored\n";
                } else {
                    /* we can have multiple clause and we merge them together now, thus we return the object that is already created */
                    new_clause = current_clauses->at(0);
                }
               if (kind == OMPC_relaxed) {
                    std::cerr << "Cannot have two relaxed clause for the directive " << kind << ", ignored\n";
                } else {
                    /* we can have multiple clause and we merge them together now, thus we return the object that is already created */
                    new_clause = current_clauses->at(0);
                }
               if (kind == OMPC_hint) {
                    std::cerr << "Cannot have two hint clause for the directive " << kind << ", ignored\n";
                } else {
                    /* we can have multiple clause and we merge them together now, thus we return the object that is already created */
                    new_clause = current_clauses->at(0);
                }
            }
            break;
        }
        case OMPC_if : {
            OpenMPIfClauseModifier modifier = (OpenMPIfClauseModifier) va_arg(args,int);
            char * user_defined_modifier = NULL;
            if (modifier == OMPC_IF_MODIFIER_user)  user_defined_modifier = va_arg(args, char*);
            new_clause = OpenMPIfClause::addIfClause(this, modifier, user_defined_modifier);
            break;
        }
        case OMPC_default : {
            OpenMPDefaultClauseKind default_kind = (OpenMPDefaultClauseKind) va_arg(args, int);
            new_clause = OpenMPDefaultClause::addDefaultClause(this, default_kind);
            break;
        }
        case OMPC_order : {
            OpenMPOrderClauseKind order_kind = (OpenMPOrderClauseKind) va_arg(args, int);
            new_clause = OpenMPOrderClause::addOrderClause(this, order_kind);
            break;
        }
        case OMPC_ext_implementation_defined_requirement : {
            new_clause = OpenMPExtImplementationDefinedRequirementClause::addExtImplementationDefinedRequirementClause(this);
            break;
        }
        case OMPC_match: {
            new_clause = OpenMPMatchClause::addMatchClause(this);
            break;
        }

        case OMPC_reduction: {
            OpenMPReductionClauseModifier modifier = (OpenMPReductionClauseModifier) va_arg(args, int);
            OpenMPReductionClauseIdentifier identifier = (OpenMPReductionClauseIdentifier) va_arg(args, int);
            char * user_defined_identifier = NULL;
            if (identifier == OMPC_REDUCTION_IDENTIFIER_user) user_defined_identifier = va_arg(args, char *);
            new_clause = OpenMPReductionClause::addReductionClause(this, modifier, identifier, user_defined_identifier);
            break;
        }
        case OMPC_proc_bind: {
            OpenMPProcBindClauseKind proc_bind_kind = (OpenMPProcBindClauseKind) va_arg(args, int);
            new_clause = OpenMPProcBindClause::addProcBindClause(this, proc_bind_kind);
            break;
        } 
        case OMPC_uses_allocators: {
            new_clause = OpenMPUsesAllocatorsClause::addUsesAllocatorsClause(this);
            break;
        }
        case OMPC_bind: {
            OpenMPBindClauseBinding bind_binding = (OpenMPBindClauseBinding) va_arg(args, int);
            new_clause = OpenMPBindClause::addBindClause(this, bind_binding);
            break;
        }

        case OMPC_lastprivate: {
            OpenMPLastprivateClauseModifier modifier = (OpenMPLastprivateClauseModifier) va_arg(args,int);
            new_clause = OpenMPLastprivateClause::addLastprivateClause(this, modifier);
            break;
        }

        case OMPC_linear: {
            OpenMPLinearClauseModifier modifier = (OpenMPLinearClauseModifier) va_arg(args,int);
            new_clause = OpenMPLinearClause::addLinearClause(this, modifier);
            break;
        }
        case OMPC_aligned:{
            new_clause = OpenMPAlignedClause::addAlignedClause(this);
            break;
        }
        case OMPC_dist_schedule: {
            OpenMPDistScheduleClauseKind dist_schedule_kind = (OpenMPDistScheduleClauseKind) va_arg(args,int);
            new_clause = OpenMPDistScheduleClause::addDistScheduleClause(this, dist_schedule_kind);
            break;
        }
        case OMPC_schedule: {
            OpenMPScheduleClauseModifier modifier1 = (OpenMPScheduleClauseModifier) va_arg(args, int);
            OpenMPScheduleClauseModifier modifier2 = (OpenMPScheduleClauseModifier) va_arg(args, int);
            OpenMPScheduleClauseKind schedule_kind = (OpenMPScheduleClauseKind) va_arg(args, int);
            char * user_defined_kind = NULL;
            if (schedule_kind == OMPC_SCHEDULE_KIND_user) user_defined_kind = va_arg(args, char *);
            new_clause = OpenMPScheduleClause::addScheduleClause(this, modifier1, modifier2, schedule_kind, user_defined_kind);

            break;
        }
        case OMPC_device : {
            OpenMPDeviceClauseModifier modifier = (OpenMPDeviceClauseModifier) va_arg(args, int);
            new_clause = OpenMPDeviceClause::addDeviceClause(this, modifier);
            break;
}

        case OMPC_initializer:{
            OpenMPInitializerClausePriv priv = (OpenMPInitializerClausePriv) va_arg(args, int);
            char* user_defined_priv = NULL;
            if (priv == OMPC_INITIALIZER_PRIV_user) user_defined_priv = va_arg(args, char *);
            new_clause = OpenMPInitializerClause::addInitializerClause(this, priv, user_defined_priv);
            break;
        }
        case OMPC_allocate : {
            OpenMPAllocateClauseAllocator allocator = (OpenMPAllocateClauseAllocator) va_arg(args, int);
            char* user_defined_allocator = NULL;
            if (allocator == OMPC_ALLOCATE_ALLOCATOR_user) user_defined_allocator = va_arg(args, char *);
            new_clause = OpenMPAllocateClause::addAllocateClause(this, allocator, user_defined_allocator);
            break;
        }
        case OMPC_allocator : {
            OpenMPAllocatorClauseAllocator allocator = (OpenMPAllocatorClauseAllocator) va_arg(args, int);
            char* user_defined_allocator = NULL;
            if (allocator == OMPC_ALLOCATOR_ALLOCATOR_user) user_defined_allocator = va_arg(args, char *);
            new_clause = OpenMPAllocatorClause::addAllocatorClause(this, allocator, user_defined_allocator);
            
            break;
        }
        case OMPC_atomic_default_mem_order : {
            OpenMPAtomicDefaultMemOrderClauseKind atomic_default_mem_order_kind = (OpenMPAtomicDefaultMemOrderClauseKind) va_arg(args, int);
            new_clause = OpenMPAtomicDefaultMemOrderClause::addAtomicDefaultMemOrderClause(this, atomic_default_mem_order_kind);
            
            break;
        }
        case OMPC_in_reduction : {
            OpenMPInReductionClauseIdentifier identifier = (OpenMPInReductionClauseIdentifier) va_arg(args, int);
            char * user_defined_identifier = NULL;
            if (identifier == OMPC_IN_REDUCTION_IDENTIFIER_user) user_defined_identifier = va_arg(args, char *);
            new_clause = OpenMPInReductionClause::addInReductionClause(this, identifier, user_defined_identifier);
            break;
        }
        case OMPC_depobj_update : {
            OpenMPDepobjUpdateClauseDependeceType type = (OpenMPDepobjUpdateClauseDependeceType) va_arg(args, int);
            new_clause = OpenMPDepobjUpdateClause::addDepobjUpdateClause(this, type);            
            break;
        }
        case OMPC_depend : {
            OpenMPDependClauseModifier modifier = (OpenMPDependClauseModifier) va_arg(args, int);
            OpenMPDependClauseType type = (OpenMPDependClauseType) va_arg(args, int);
            new_clause = OpenMPDependClause::addDependClause(this, modifier, type);
            break;
        }
        case OMPC_affinity : {
            OpenMPAffinityClauseModifier modifier = (OpenMPAffinityClauseModifier) va_arg(args, int);
            new_clause = OpenMPAffinityClause::addAffinityClause(this, modifier);
            break;
        }
        case OMPC_to : {
            OpenMPToClauseKind to_kind = (OpenMPToClauseKind) va_arg(args, int);
            new_clause = OpenMPToClause::addToClause(this, to_kind);
            break;
        }
        case OMPC_from : {
            OpenMPFromClauseKind from_kind = (OpenMPFromClauseKind) va_arg(args, int);
            new_clause = OpenMPFromClause::addFromClause(this, from_kind);
            break;
        }

        case OMPC_device_type : {
            OpenMPDeviceTypeClauseKind device_type_kind = (OpenMPDeviceTypeClauseKind) va_arg(args, int);
            new_clause = OpenMPDeviceTypeClause::addDeviceTypeClause(this, device_type_kind);
            break;
        }
 
        case OMPC_defaultmap : {
            OpenMPDefaultmapClauseBehavior behavior = (OpenMPDefaultmapClauseBehavior) va_arg(args,int);
            OpenMPDefaultmapClauseCategory category = (OpenMPDefaultmapClauseCategory) va_arg(args,int);
            new_clause = OpenMPDefaultmapClause::addDefaultmapClause(this, behavior, category);
            break;        
        }
        case OMPC_task_reduction : {
            OpenMPTaskReductionClauseIdentifier identifier = (OpenMPTaskReductionClauseIdentifier) va_arg(args, int);
            char * user_defined_identifier = NULL;
            if (identifier == OMPC_TASK_REDUCTION_IDENTIFIER_user) user_defined_identifier = va_arg(args, char *);
            new_clause = OpenMPTaskReductionClause::addTaskReductionClause(this, identifier, user_defined_identifier);
            break;
        }
        case OMPC_map: {
            OpenMPMapClauseModifier modifier1 = (OpenMPMapClauseModifier)va_arg(args, int);
            OpenMPMapClauseModifier modifier2 = (OpenMPMapClauseModifier)va_arg(args, int);
            OpenMPMapClauseModifier modifier3 = (OpenMPMapClauseModifier)va_arg(args, int);
            OpenMPMapClauseType type = (OpenMPMapClauseType)va_arg(args, int);
            std::string mapper_identifier = (std::string)va_arg(args, char*);
            new_clause = OpenMPMapClause::addMapClause(this, modifier1, modifier2, modifier3, type, mapper_identifier);
            break;
        }
        case OMPC_when: {
            new_clause = OpenMPWhenClause::addWhenClause(this);
            break;
        }
        default: {
            ;
        }
    };

    va_end(args);
    if (new_clause != NULL && new_clause->getClausePosition() == -1) {
        this->getClausesInOriginalOrder()->push_back(new_clause);
        new_clause->setClausePosition(this->getClausesInOriginalOrder()->size()-1);
    };
    return new_clause;
}